

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicMaxCase::verify
          (ShaderAtomicMaxCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar5;
  int in_stack_00000008;
  long in_stack_00000010;
  MessageBuilder local_588;
  _Base_ptr local_408;
  undefined1 local_400;
  Hex<8UL> local_3f8;
  MessageBuilder local_3f0;
  deUint32 local_270;
  int local_26c;
  deUint32 outputValue;
  int localNdx_1;
  Hex<8UL> local_260;
  MessageBuilder local_258;
  _Base_ptr local_d8;
  undefined1 local_d0;
  int local_b4;
  int local_b0;
  deInt32 inputValue;
  int localNdx;
  int maxValue;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> outValues;
  set<int,_std::less<int>,_std::allocator<int>_> inValues;
  deUint32 groupOutput;
  int groupOffset;
  int groupNdx;
  uint uStack_34;
  bool anyError;
  int numWorkGroups;
  int workGroupSize;
  void *outputs_local;
  size_t sStack_20;
  int outputStride_local;
  void *inputs_local;
  int inputStride_local;
  int numValues_local;
  ShaderAtomicMaxCase *this_local;
  
  outputs_local._4_4_ = (int)tbs;
  inputs_local._4_4_ = (int)ctx;
  inputs_local._0_4_ = (int)sig;
  _numWorkGroups = tbslen;
  sStack_20 = siglen;
  _inputStride_local = this;
  uStack_34 = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  groupNdx = inputs_local._4_4_ / (int)uStack_34;
  groupOffset._3_1_ = 0;
  for (groupOutput = 0; (int)groupOutput < groupNdx; groupOutput = groupOutput + 1) {
    inValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = groupOutput * uStack_34;
    inValues._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         *(deUint32 *)(in_stack_00000010 + (int)(groupOutput * in_stack_00000008));
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &outValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &localNdx);
    inputValue = (this->super_ShaderAtomicOpCase).m_initialValue;
    for (local_b0 = 0; local_b0 < (int)uStack_34; local_b0 = local_b0 + 1) {
      local_b4 = *(int *)(sStack_20 +
                         (long)((int)inputs_local *
                               (inValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
                               local_b0)));
      pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &outValues._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_b4);
      local_d8 = (_Base_ptr)pVar4.first._M_node;
      local_d0 = pVar4.second;
      inputValue = de::max<int>(inputValue,local_b4);
    }
    bVar1 = intEqualsAfterUintCast
                      (inputValue,
                       (deUint32)inValues._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (this->super_ShaderAtomicOpCase).m_precision);
    if (!bVar1) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_258,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_258,(char (*) [17])"ERROR: at group ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&groupOutput);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])": expected maximum ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&inputValue);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0xf0992d);
      tcu::Format::Hex<8UL>::Hex(&local_260,(ulong)(uint)inputValue);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_260);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf2e642);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0xf925e6);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(uint *)&inValues._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0xf0992d);
      tcu::Format::Hex<8UL>::Hex
                ((Hex<8UL> *)&outputValue,
                 (ulong)(deUint32)inValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(Hex<8UL> *)&outputValue);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf2e642);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_258);
      groupOffset._3_1_ = 1;
    }
    for (local_26c = 0; local_26c < (int)uStack_34; local_26c = local_26c + 1) {
      local_270 = *(deUint32 *)
                   (_numWorkGroups +
                   (long)(outputs_local._4_4_ *
                         (inValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
                         local_26c)));
      bVar1 = containsAfterUintCast
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &outValues._M_t._M_impl.super__Rb_tree_header._M_node_count,local_270,
                         (this->super_ShaderAtomicOpCase).m_precision);
      if (!bVar1) {
        bVar1 = intEqualsAfterUintCast
                          ((this->super_ShaderAtomicOpCase).m_initialValue,local_270,
                           (this->super_ShaderAtomicOpCase).m_precision);
        if (!bVar1) {
          pTVar2 = tcu::TestContext::getLog
                             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3f0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar3 = tcu::MessageBuilder::operator<<(&local_3f0,(char (*) [17])"ERROR: at group ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&groupOutput);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])", invocation ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_26c);
          pMVar3 = tcu::MessageBuilder::operator<<
                             (pMVar3,(char (*) [26])": found unexpected value ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_270);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0xf0992d);
          tcu::Format::Hex<8UL>::Hex(&local_3f8,(ulong)local_270);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3f8);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf2e642);
          tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3f0);
          groupOffset._3_1_ = 1;
        }
      }
      pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&localNdx,&local_270);
      local_408 = (_Base_ptr)pVar5.first._M_node;
      local_400 = pVar5.second;
    }
    bVar1 = containsAfterUintCast
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &localNdx,(this->super_ShaderAtomicOpCase).m_initialValue,
                       (this->super_ShaderAtomicOpCase).m_precision);
    if (!bVar1) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_588,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_588,
                          (char (*) [48])"ERROR: could not find initial value from group ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&groupOutput);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_588);
      groupOffset._3_1_ = 1;
    }
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &localNdx);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &outValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return (CONCAT31((int3)(groupOutput >> 8),groupOffset._3_1_) ^ 0xff) & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;
		bool		anyError		= false;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>		inValues;
			set<deUint32>	outValues;
			int				maxValue		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deInt32 inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				inValues.insert(inputValue);
				maxValue = de::max(maxValue, inputValue);
			}

			if (!intEqualsAfterUintCast(maxValue, groupOutput, m_precision))
			{
				m_testCtx.getLog()
					<< TestLog::Message
					<< "ERROR: at group " << groupNdx
					<< ": expected maximum " << maxValue << " (" << tcu::Format::Hex<8>((deUint32)maxValue) << ")"
					<< ", got " << groupOutput << " (" << tcu::Format::Hex<8>(groupOutput) << ")"
					<< TestLog::EndMessage;
				anyError = true;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!containsAfterUintCast(inValues, outputValue, m_precision) &&
					!intEqualsAfterUintCast((deInt32)m_initialValue, outputValue, m_precision))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
														   << " (" << tcu::Format::Hex<8>(outputValue) << ")"
									   << TestLog::EndMessage;
					anyError = true;
				}

				outValues.insert(outputValue);
			}

			if (!containsAfterUintCast(outValues, (int)m_initialValue, m_precision))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				anyError = true;
			}
		}

		return !anyError;
	}